

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::NoopNormalizer2::normalize
          (NoopNormalizer2 *this,UnicodeString *src,UnicodeString *dest,UErrorCode *errorCode)

{
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (dest == src) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      UnicodeString::operator=(dest,src);
    }
  }
  return dest;
}

Assistant:

virtual UnicodeString &
    normalize(const UnicodeString &src,
              UnicodeString &dest,
              UErrorCode &errorCode) const U_OVERRIDE {
        if(U_SUCCESS(errorCode)) {
            if(&dest!=&src) {
                dest=src;
            } else {
                errorCode=U_ILLEGAL_ARGUMENT_ERROR;
            }
        }
        return dest;
    }